

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

Test * __thiscall
testing::internal::TestFactoryImpl<CTestResource_Test1DLinearResource_Test>::CreateTest
          (TestFactoryImpl<CTestResource_Test1DLinearResource_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x10);
  if (this_00 != (Test *)0x0) {
    CTestResource_Test1DLinearResource_Test::CTestResource_Test1DLinearResource_Test
              ((CTestResource_Test1DLinearResource_Test *)this_00);
  }
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }